

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O0

HTS_Boolean HTS_is_num(char *buff)

{
  size_t sVar1;
  ushort **ppuVar2;
  char *in_RDI;
  size_t length;
  size_t i;
  ulong local_18;
  
  sVar1 = strlen(in_RDI);
  local_18 = 0;
  while( true ) {
    if (sVar1 <= local_18) {
      return '\x01';
    }
    ppuVar2 = __ctype_b_loc();
    if ((((*ppuVar2)[(int)in_RDI[local_18]] & 0x800) == 0) && (in_RDI[local_18] != '-')) break;
    local_18 = local_18 + 1;
  }
  return '\0';
}

Assistant:

static HTS_Boolean HTS_is_num(const char *buff)
{
   size_t i;
   size_t length = strlen(buff);

   for (i = 0; i < length; i++)
      if (!(isdigit((int) buff[i]) || (buff[i] == '-')))
         return FALSE;

   return TRUE;
}